

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOS65XXDisassembler.c
# Opt level: O0

_Bool MOS65XX_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *inst_info)

{
  byte opcode_00;
  mos65xx_insn mVar1;
  byte bVar2;
  int iVar3;
  MCInst *in_RCX;
  ulong in_RDX;
  byte *in_RSI;
  ushort *in_R8;
  uint64_t in_R9;
  mos65xx_insn ins;
  uchar len;
  uchar opcode;
  _Bool local_1;
  
  if (in_RDX == 0) {
    *in_R8 = 1;
    local_1 = false;
  }
  else {
    opcode_00 = *in_RSI;
    mVar1 = OpInfoTable[opcode_00].ins;
    if (mVar1 == MOS65XX_INS_INVALID) {
      *in_R8 = 1;
      local_1 = false;
    }
    else {
      iVar3 = getInstructionLength(OpInfoTable[opcode_00].am);
      bVar2 = (byte)iVar3;
      if (in_RDX < bVar2) {
        *in_R8 = 1;
        local_1 = false;
      }
      else {
        in_RCX->address = in_R9;
        in_RCX->Opcode = (uint)opcode_00;
        in_RCX->OpcodePub = mVar1;
        in_RCX->size = '\0';
        *in_R8 = (ushort)bVar2;
        if (bVar2 == 2) {
          MCOperand_CreateImm0(in_RCX,(ulong)in_RSI[1]);
        }
        else if (bVar2 == 3) {
          MCOperand_CreateImm0(in_RCX,(long)(int)(uint)*(ushort *)(in_RSI + 1));
        }
        if (in_RCX->flat_insn->detail != (cs_detail *)0x0) {
          fillDetails(in_RCX,opcode_00);
        }
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool MOS65XX_getInstruction(csh ud, const uint8_t *code, size_t code_len,
							MCInst *MI, uint16_t *size, uint64_t address, void *inst_info)
{
	unsigned char opcode;
	unsigned char len;
	mos65xx_insn ins;

	if (code_len == 0) {
		*size = 1;
		return false;
	}

	opcode = code[0];
	ins = OpInfoTable[opcode].ins;
	if (ins == MOS65XX_INS_INVALID) {
		*size = 1;
		return false;
	}

	len = getInstructionLength(OpInfoTable[opcode].am);
	if (code_len < len) {
		*size = 1;
		return false;
	}

	MI->address = address;
	MI->Opcode = opcode;
	MI->OpcodePub = ins;
	MI->size = 0;

	*size = len;
	if (len == 2) {
		MCOperand_CreateImm0(MI, code[1]);
	} else
	if (len == 3) {
		MCOperand_CreateImm0(MI, (code[2]<<8) | code[1]);
	}
#ifndef CAPSTONE_DIET
	if (MI->flat_insn->detail) {
		fillDetails(MI, opcode);
	}
#endif

	return true;
}